

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O0

logical pnga_set_update5_info(Integer g_a)

{
  short sVar1;
  short sVar2;
  int iVar3;
  long *plVar4;
  long lVar5;
  Integer IVar6;
  logical lVar7;
  long lVar8;
  double *pdVar9;
  void *__ptr;
  long *__ptr_00;
  int *piVar10;
  int *piVar11;
  size_t sVar12;
  Integer IVar13;
  long *plVar14;
  long *plVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  long in_RDI;
  int _d_15;
  int _i_21;
  int _ndim_19;
  int _i_20;
  int _itmp_7;
  int _offset_7;
  int _ndim_18;
  int _i_19;
  int _index_15 [7];
  int _ndim_17;
  int _i_18;
  int _itmp_6;
  int _ndim_16;
  int _i_17;
  int _index_14 [7];
  int _ndim_15;
  int _i_16;
  Integer _dimpos_7;
  Integer _dimstart_7;
  Integer _dim_7;
  Integer _index_13;
  Integer _d_14;
  Integer _nb_7;
  Integer _loc_7;
  Integer _dimpos_6;
  Integer _dimstart_6;
  Integer _dim_6;
  Integer _index_12;
  Integer _d_13;
  Integer _nb_6;
  Integer _loc_6;
  Integer _hi_3 [7];
  Integer _lo_3 [7];
  Integer _offset_6;
  Integer _last_3;
  Integer _factor_3;
  Integer _d_12;
  int _ndim_14;
  int _i_15;
  int _itmp_5;
  int _offset_5;
  int _ndim_13;
  int _i_14;
  int _index_11 [7];
  int _ndim_12;
  int _i_13;
  int _itmp_4;
  int _ndim_11;
  int _i_12;
  int _index_10 [7];
  int _ndim_10;
  int _i_11;
  Integer _dimpos_5;
  Integer _dimstart_5;
  Integer _dim_5;
  Integer _index_9;
  Integer _d_11;
  Integer _nb_5;
  Integer _loc_5;
  Integer _dimpos_4;
  Integer _dimstart_4;
  Integer _dim_4;
  Integer _index_8;
  Integer _d_10;
  Integer _nb_4;
  Integer _loc_4;
  Integer _hi_2 [7];
  Integer _lo_2 [7];
  Integer _offset_4;
  Integer _last_2;
  Integer _factor_2;
  Integer _d_9;
  char err_string_1 [256];
  char *str_1;
  int _l_1;
  int _d_8;
  int _d_7;
  int _i_10;
  int _ndim_9;
  int _i_9;
  int _itmp_3;
  int _offset_3;
  int _ndim_8;
  int _i_8;
  int _index_7 [7];
  int _ndim_7;
  int _i_7;
  int _itmp_2;
  int _ndim_6;
  int _i_6;
  int _index_6 [7];
  int _ndim_5;
  int _i_5;
  Integer _dimpos_3;
  Integer _dimstart_3;
  Integer _dim_3;
  Integer _index_5;
  Integer _d_6;
  Integer _nb_3;
  Integer _loc_3;
  Integer _dimpos_2;
  Integer _dimstart_2;
  Integer _dim_2;
  Integer _index_4;
  Integer _d_5;
  Integer _nb_2;
  Integer _loc_2;
  Integer _hi_1 [7];
  Integer _lo_1 [7];
  Integer _offset_2;
  Integer _last_1;
  Integer _factor_1;
  Integer _d_4;
  int _ndim_4;
  int _i_4;
  int _itmp_1;
  int _offset_1;
  int _ndim_3;
  int _i_3;
  int _index_3 [7];
  int _ndim_2;
  int _i_2;
  int _itmp;
  int _ndim_1;
  int _i_1;
  int _index_2 [7];
  int _ndim;
  int _i;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_3;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d_2;
  Integer _nb;
  Integer _loc;
  Integer _hi [7];
  Integer _lo [7];
  Integer _offset;
  Integer _last;
  Integer _factor;
  Integer _d_1;
  char err_string [256];
  char *str;
  int _l;
  int _d;
  Integer *_ga_proclist;
  Integer *_ga_map;
  Integer p_handle;
  Integer me;
  int cache_size;
  Integer handle;
  char *cache;
  char **ptr_rem;
  char **ptr_loc;
  int corner_flag;
  int idx;
  int *count;
  int *stride_rem;
  int *stride_loc;
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer phi_rem [7];
  Integer plo_rem [7];
  Integer shi_rem [7];
  Integer slo_rem [7];
  Integer thi_rem [7];
  Integer tlo_rem [7];
  Integer plo_loc [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer dims [7];
  Integer width [7];
  Integer np;
  Integer increment [7];
  Integer nwidth;
  Integer ndim;
  Integer size;
  Integer *proc_rem;
  int i;
  Integer *in_stack_fffffffffffff388;
  Integer *in_stack_fffffffffffff390;
  int in_stack_fffffffffffff398;
  int in_stack_fffffffffffff39c;
  int in_stack_fffffffffffff3a0;
  int in_stack_fffffffffffff3a4;
  int local_c58;
  int local_c54;
  int in_stack_fffffffffffff3b0;
  int in_stack_fffffffffffff3b4;
  undefined4 in_stack_fffffffffffff3b8;
  undefined4 in_stack_fffffffffffff3bc;
  int local_c28;
  int local_c24;
  int local_c1c;
  int local_c18 [10];
  int local_bf0;
  int local_bec;
  long local_be8;
  long local_be0;
  long local_bd8;
  long local_bd0;
  long local_bc8;
  long local_bc0;
  long local_bb8;
  long local_bb0;
  long local_ba8;
  long local_ba0;
  long local_b98;
  long local_b90;
  long local_b88;
  long local_b80;
  long local_b78 [8];
  long local_b38 [7];
  long local_b00;
  long local_af8;
  long local_af0;
  long in_stack_fffffffffffff518;
  int in_stack_fffffffffffff520;
  int in_stack_fffffffffffff524;
  int local_ad8;
  int local_ad4;
  int local_acc;
  int local_ac8 [7];
  int local_aac;
  int local_aa8;
  int local_aa4;
  int local_aa0;
  int local_a9c;
  int local_a98 [2];
  Integer in_stack_fffffffffffff570;
  int local_a6c;
  long local_a60;
  Integer local_a50;
  long local_a48;
  long local_a40;
  long local_a28;
  Integer local_a18;
  long local_a10;
  long local_a08;
  long local_9f8 [8];
  long local_9b8 [8];
  Integer *in_stack_fffffffffffff688;
  long lVar20;
  Integer *in_stack_fffffffffffff690;
  long in_stack_fffffffffffff698;
  long in_stack_fffffffffffff6a0;
  char local_958 [256];
  char *local_858;
  int local_850;
  int local_84c;
  int local_848;
  int local_844;
  int local_840;
  int local_83c;
  int local_838;
  int local_834;
  int local_830;
  int local_82c;
  int local_828 [7];
  int local_80c;
  int local_808;
  int local_804;
  int local_800;
  int local_7fc;
  int local_7f8 [10];
  int local_7d0;
  int local_7cc;
  long local_7c8;
  long local_7c0;
  long local_7b8;
  long local_7b0;
  long local_7a8;
  long local_7a0;
  long local_798;
  long local_790;
  long local_788;
  long local_780;
  long local_778;
  long local_770;
  long local_768;
  long local_760;
  long local_758 [8];
  long local_718 [7];
  long local_6e0;
  long local_6d8;
  long local_6d0;
  long local_6c8;
  int local_6c0;
  int local_6bc;
  int local_6b8;
  int local_6b4;
  int local_6b0;
  int local_6ac;
  int local_6a8 [7];
  int local_68c;
  int local_688;
  int local_684;
  int local_680;
  int local_67c;
  int local_678 [10];
  int local_650;
  int local_64c;
  long local_648;
  long local_640;
  long local_638;
  Integer local_630;
  long local_628;
  long local_620;
  long local_618;
  long local_610;
  long local_608;
  long local_600;
  Integer local_5f8;
  long local_5f0;
  long local_5e8;
  long local_5e0;
  long local_5d8 [8];
  long local_598 [8];
  long local_558;
  long local_550;
  long local_548;
  long local_540;
  char local_538 [168];
  Integer *in_stack_fffffffffffffb70;
  Integer *in_stack_fffffffffffffb78;
  Integer *in_stack_fffffffffffffb80;
  Integer *in_stack_fffffffffffffb88;
  Integer *in_stack_fffffffffffffb90;
  Integer in_stack_fffffffffffffb98;
  int local_428;
  int local_424;
  double *local_3f0;
  int local_3d4;
  long local_3b8 [8];
  long local_378 [8];
  long alStack_338 [8];
  long alStack_2f8 [8];
  undefined8 local_2b8 [8];
  undefined8 local_278 [8];
  long local_238 [8];
  long local_1f8 [8];
  Integer aIStack_1b8 [8];
  long local_178 [8];
  long local_138 [8];
  Integer local_f8 [8];
  Integer local_b8 [8];
  long alStack_78 [8];
  long local_38;
  long local_30;
  long local_28;
  long *local_20;
  int local_14;
  Integer local_10;
  logical local_8;
  
  lVar5 = in_RDI + 1000;
  local_10 = in_RDI;
  IVar6 = pnga_nodeid();
  lVar7 = pnga_has_ghosts(local_10);
  if (lVar7 == 0) {
    local_8 = 1;
  }
  else {
    lVar7 = gai_check_ghost_distr(local_10);
    if (lVar7 == 0) {
      local_8 = 0;
    }
    else {
      local_30 = (long)GA[lVar5].ndim;
      lVar8 = (long)GA[lVar5].p_handle;
      local_28 = (long)GA[lVar5].elemsize;
      pdVar9 = (double *)malloc((long)(GA[lVar5].ndim * 10) << 3);
      GA[lVar5].cache = pdVar9;
      local_3f0 = GA[lVar5].cache;
      iVar3 = GA[lVar5].corner_flag;
      pnga_distribution(in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
                        in_stack_fffffffffffff690,in_stack_fffffffffffff688);
      for (local_3d4 = 0; local_3d4 < local_30; local_3d4 = local_3d4 + 1) {
        alStack_78[local_3d4] = 0;
        local_b8[local_3d4] = GA[lVar5].width[local_3d4];
        local_f8[local_3d4] = GA[lVar5].dims[local_3d4];
        if ((local_138[local_3d4] == 0) && (local_178[local_3d4] == -1)) {
          *local_3f0 = 0.0;
          return 0;
        }
      }
      __ptr = malloc((GAnproc * 0xe + 1) * 8);
      if (__ptr == (void *)0x0) {
        pnga_error((char *)CONCAT44(in_stack_fffffffffffff524,in_stack_fffffffffffff520),
                   in_stack_fffffffffffff518);
      }
      __ptr_00 = (long *)malloc(GAnproc << 3);
      if (__ptr_00 == (long *)0x0) {
        pnga_error((char *)CONCAT44(in_stack_fffffffffffff524,in_stack_fffffffffffff520),
                   in_stack_fffffffffffff518);
      }
      for (local_3d4 = 0; local_3d4 < local_30; local_3d4 = local_3d4 + 1) {
        local_38 = local_b8[local_3d4];
        if (local_b8[local_3d4] != 0) {
          pdVar9 = local_3f0 + 2;
          piVar10 = (int *)((long)pdVar9 + local_30 * 4);
          piVar11 = piVar10 + local_30;
          local_20 = (long *)(piVar11 + local_30);
          get_remote_block_neg
                    (CONCAT44(in_stack_fffffffffffff3a4,in_stack_fffffffffffff3a0),
                     CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398),
                     in_stack_fffffffffffff390,in_stack_fffffffffffff388,local_b8,local_f8,
                     (Integer *)CONCAT44(in_stack_fffffffffffff3b4,in_stack_fffffffffffff3b0),
                     (Integer *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
          lVar7 = pnga_locate_region(in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
                                     in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                                     in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
          if (lVar7 == 0) {
            sprintf(local_538,"%s","cannot locate region: ");
            sVar12 = strlen("cannot locate region: ");
            sprintf(local_538 + (int)sVar12,"%s",GA[local_10 + 1000].name);
            sVar12 = strlen(local_538);
            sprintf(local_538 + (int)sVar12," [%ld:%ld ",local_278[0],local_2b8[0]);
            sVar12 = strlen(local_538);
            local_428 = (int)sVar12;
            local_424 = 1;
            while( true ) {
              in_stack_fffffffffffff390 = (Integer *)(long)local_424;
              IVar13 = pnga_ndim(in_stack_fffffffffffff570);
              if (IVar13 <= (long)in_stack_fffffffffffff390) break;
              sprintf(local_538 + local_428,",%ld:%ld ",local_278[local_424],local_2b8[local_424]);
              sVar12 = strlen(local_538);
              local_428 = (int)sVar12;
              local_424 = local_424 + 1;
            }
            sprintf(local_538 + local_428,"%s","]");
            strlen(local_538);
            pnga_error((char *)CONCAT44(in_stack_fffffffffffff524,in_stack_fffffffffffff520),
                       in_stack_fffffffffffff518);
          }
          plVar4 = local_20;
          *local_20 = *__ptr_00;
          if (-1 < lVar8) {
            *local_20 = (long)PGRP_LIST[lVar8].inv_map_proc_list[*local_20];
          }
          plVar14 = local_20 + 1;
          pnga_distribution(in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
                            in_stack_fffffffffffff690,in_stack_fffffffffffff688);
          for (local_14 = 0; local_14 < local_30; local_14 = local_14 + 1) {
            if (alStack_78[local_14] == 0) {
              if (local_14 == local_3d4) {
                alStack_2f8[local_14] =
                     (local_238[local_14] - local_1f8[local_14]) + local_b8[local_14] + 1;
                alStack_338[local_14] =
                     (local_238[local_14] - local_1f8[local_14]) + local_b8[local_14] * 2;
                aIStack_1b8[local_14] = local_b8[local_14];
              }
              else {
                alStack_2f8[local_14] = local_b8[local_14];
                alStack_338[local_14] =
                     (local_238[local_14] - local_1f8[local_14]) + local_b8[local_14];
                aIStack_1b8[local_14] = local_b8[local_14];
              }
            }
            else {
              alStack_2f8[local_14] = 0;
              alStack_338[local_14] =
                   (local_238[local_14] - local_1f8[local_14]) + alStack_78[local_14];
              aIStack_1b8[local_14] = 0;
            }
          }
          local_548 = 1;
          local_550 = (long)(GA[lVar5].ndim + -1);
          local_558 = 0;
          if (GA[lVar5].distr_type == 0) {
            if (GA[lVar5].num_rstrctd == 0) {
              local_600 = (long)GA[lVar5].ndim;
              local_608 = 0;
              local_5e8 = 1;
              for (local_5f0 = 0; local_5f0 < local_600; local_5f0 = local_5f0 + 1) {
                local_5e8 = GA[lVar5].nblock[local_5f0] * local_5e8;
              }
              if ((local_5e8 + -1 < IVar6) || (IVar6 < 0)) {
                for (local_5f0 = 0; local_5f0 < local_600; local_5f0 = local_5f0 + 1) {
                  local_598[local_5f0] = 0;
                  local_5d8[local_5f0] = -1;
                }
              }
              else {
                local_5f8 = IVar6;
                for (local_5f0 = 0; local_5f0 < local_600; local_5f0 = local_5f0 + 1) {
                  local_5e0 = local_5f8 % (long)GA[lVar5].nblock[local_5f0];
                  local_5f8 = local_5f8 / (long)GA[lVar5].nblock[local_5f0];
                  local_610 = local_5e0 + local_608;
                  local_608 = GA[lVar5].nblock[local_5f0] + local_608;
                  local_598[local_5f0] = GA[lVar5].mapc[local_610];
                  if (local_5e0 == GA[lVar5].nblock[local_5f0] + -1) {
                    local_5d8[local_5f0] = GA[lVar5].dims[local_5f0];
                  }
                  else {
                    local_5d8[local_5f0] = GA[lVar5].mapc[local_610 + 1] + -1;
                  }
                }
              }
            }
            else if (IVar6 < GA[lVar5].num_rstrctd) {
              local_638 = (long)GA[lVar5].ndim;
              local_640 = 0;
              local_620 = 1;
              for (local_628 = 0; local_628 < local_638; local_628 = local_628 + 1) {
                local_620 = GA[lVar5].nblock[local_628] * local_620;
              }
              if ((local_620 + -1 < IVar6) || (IVar6 < 0)) {
                for (local_628 = 0; local_628 < local_638; local_628 = local_628 + 1) {
                  local_598[local_628] = 0;
                  local_5d8[local_628] = -1;
                }
              }
              else {
                local_630 = IVar6;
                for (local_628 = 0; local_628 < local_638; local_628 = local_628 + 1) {
                  local_618 = local_630 % (long)GA[lVar5].nblock[local_628];
                  local_630 = local_630 / (long)GA[lVar5].nblock[local_628];
                  local_648 = local_618 + local_640;
                  local_640 = GA[lVar5].nblock[local_628] + local_640;
                  local_598[local_628] = GA[lVar5].mapc[local_648];
                  if (local_618 == GA[lVar5].nblock[local_628] + -1) {
                    local_5d8[local_628] = GA[lVar5].dims[local_628];
                  }
                  else {
                    local_5d8[local_628] = GA[lVar5].mapc[local_648 + 1] + -1;
                  }
                }
              }
            }
            else {
              sVar1 = GA[lVar5].ndim;
              local_650 = (int)sVar1;
              for (local_64c = 0; local_64c < sVar1; local_64c = local_64c + 1) {
                local_598[local_64c] = 0;
                local_5d8[local_64c] = -1;
              }
            }
          }
          else {
            iVar18 = (int)IVar6;
            if (((GA[lVar5].distr_type == 1) || (GA[lVar5].distr_type == 2)) ||
               (GA[lVar5].distr_type == 3)) {
              sVar1 = GA[lVar5].ndim;
              local_680 = (int)sVar1;
              sVar2 = GA[lVar5].ndim;
              local_68c = (int)sVar2;
              local_684 = iVar18;
              local_678[0] = (int)((long)iVar18 % GA[lVar5].num_blocks[0]);
              for (local_688 = 1; local_688 < sVar2; local_688 = local_688 + 1) {
                local_684 = (int)((long)(local_684 - local_678[local_688 + -1]) /
                                 GA[lVar5].num_blocks[local_688 + -1]);
                local_678[local_688] = (int)((long)local_684 % GA[lVar5].num_blocks[local_688]);
              }
              for (local_67c = 0; local_67c < sVar1; local_67c = local_67c + 1) {
                local_598[local_67c] =
                     (long)local_678[local_67c] * GA[lVar5].block_dims[local_67c] + 1;
                local_5d8[local_67c] =
                     (long)(local_678[local_67c] + 1) * GA[lVar5].block_dims[local_67c];
                if (GA[lVar5].dims[local_67c] < local_5d8[local_67c]) {
                  local_5d8[local_67c] = GA[lVar5].dims[local_67c];
                }
              }
            }
            else if (GA[lVar5].distr_type == 4) {
              sVar1 = GA[lVar5].ndim;
              local_6b0 = (int)sVar1;
              local_6b4 = 0;
              sVar2 = GA[lVar5].ndim;
              local_6c0 = (int)sVar2;
              local_6b8 = iVar18;
              local_6a8[0] = (int)((long)iVar18 % GA[lVar5].num_blocks[0]);
              for (local_6bc = 1; local_6bc < sVar2; local_6bc = local_6bc + 1) {
                local_6b8 = (int)((long)(local_6b8 - local_6a8[local_6bc + -1]) /
                                 GA[lVar5].num_blocks[local_6bc + -1]);
                local_6a8[local_6bc] = (int)((long)local_6b8 % GA[lVar5].num_blocks[local_6bc]);
              }
              for (local_6ac = 0; local_6ac < sVar1; local_6ac = local_6ac + 1) {
                local_598[local_6ac] = GA[lVar5].mapc[local_6b4 + local_6a8[local_6ac]];
                if ((long)local_6a8[local_6ac] < GA[lVar5].num_blocks[local_6ac] + -1) {
                  local_5d8[local_6ac] = GA[lVar5].mapc[local_6b4 + local_6a8[local_6ac] + 1] + -1;
                }
                else {
                  local_5d8[local_6ac] = GA[lVar5].dims[local_6ac];
                }
                local_6b4 = local_6b4 + (int)GA[lVar5].num_blocks[local_6ac];
              }
            }
          }
          if (local_550 == 0) {
            local_378[0] = (local_5d8[0] - local_598[0]) + 1 + GA[lVar5].width[0] * 2;
          }
          for (local_540 = 0; local_540 < local_550; local_540 = local_540 + 1) {
            local_558 = aIStack_1b8[local_540] * local_548 + local_558;
            local_378[local_540] =
                 (local_5d8[local_540] - local_598[local_540]) + 1 + GA[lVar5].width[local_540] * 2;
            local_548 = local_378[local_540] * local_548;
          }
          local_558 = aIStack_1b8[local_550] * local_548 + local_558;
          local_3f0[1] = (double)(GA[lVar5].ptr[IVar6] + local_558 * GA[lVar5].elemsize);
          local_6d0 = 1;
          local_6d8 = (long)(GA[lVar5].ndim + -1);
          local_6e0 = 0;
          if (GA[lVar5].distr_type == 0) {
            if (GA[lVar5].num_rstrctd == 0) {
              local_780 = (long)GA[lVar5].ndim;
              local_788 = 0;
              local_768 = 1;
              for (local_770 = 0; local_770 < local_780; local_770 = local_770 + 1) {
                local_768 = GA[lVar5].nblock[local_770] * local_768;
              }
              if ((local_768 + -1 < *local_20) || (*local_20 < 0)) {
                for (local_770 = 0; local_770 < local_780; local_770 = local_770 + 1) {
                  local_718[local_770] = 0;
                  local_758[local_770] = -1;
                }
              }
              else {
                local_778 = *local_20;
                for (local_770 = 0; local_770 < local_780; local_770 = local_770 + 1) {
                  local_760 = local_778 % (long)GA[lVar5].nblock[local_770];
                  local_778 = local_778 / (long)GA[lVar5].nblock[local_770];
                  local_790 = local_760 + local_788;
                  local_788 = GA[lVar5].nblock[local_770] + local_788;
                  local_718[local_770] = GA[lVar5].mapc[local_790];
                  if (local_760 == GA[lVar5].nblock[local_770] + -1) {
                    local_758[local_770] = GA[lVar5].dims[local_770];
                  }
                  else {
                    local_758[local_770] = GA[lVar5].mapc[local_790 + 1] + -1;
                  }
                }
              }
            }
            else if (*local_20 < GA[lVar5].num_rstrctd) {
              local_7b8 = (long)GA[lVar5].ndim;
              local_7c0 = 0;
              local_7a0 = 1;
              for (local_7a8 = 0; local_7a8 < local_7b8; local_7a8 = local_7a8 + 1) {
                local_7a0 = GA[lVar5].nblock[local_7a8] * local_7a0;
              }
              if ((local_7a0 + -1 < *local_20) || (*local_20 < 0)) {
                for (local_7a8 = 0; local_7a8 < local_7b8; local_7a8 = local_7a8 + 1) {
                  local_718[local_7a8] = 0;
                  local_758[local_7a8] = -1;
                }
              }
              else {
                local_7b0 = *local_20;
                for (local_7a8 = 0; local_7a8 < local_7b8; local_7a8 = local_7a8 + 1) {
                  local_798 = local_7b0 % (long)GA[lVar5].nblock[local_7a8];
                  local_7b0 = local_7b0 / (long)GA[lVar5].nblock[local_7a8];
                  local_7c8 = local_798 + local_7c0;
                  local_7c0 = GA[lVar5].nblock[local_7a8] + local_7c0;
                  local_718[local_7a8] = GA[lVar5].mapc[local_7c8];
                  if (local_798 == GA[lVar5].nblock[local_7a8] + -1) {
                    local_758[local_7a8] = GA[lVar5].dims[local_7a8];
                  }
                  else {
                    local_758[local_7a8] = GA[lVar5].mapc[local_7c8 + 1] + -1;
                  }
                }
              }
            }
            else {
              sVar1 = GA[lVar5].ndim;
              local_7d0 = (int)sVar1;
              for (local_7cc = 0; local_7cc < sVar1; local_7cc = local_7cc + 1) {
                local_718[local_7cc] = 0;
                local_758[local_7cc] = -1;
              }
            }
          }
          else if (((GA[lVar5].distr_type == 1) || (GA[lVar5].distr_type == 2)) ||
                  (GA[lVar5].distr_type == 3)) {
            sVar1 = GA[lVar5].ndim;
            local_800 = (int)sVar1;
            sVar2 = GA[lVar5].ndim;
            local_80c = (int)sVar2;
            local_804 = (int)*local_20;
            local_7f8[0] = (int)((long)(int)*local_20 % GA[lVar5].num_blocks[0]);
            for (local_808 = 1; local_808 < sVar2; local_808 = local_808 + 1) {
              local_804 = (int)((long)(local_804 - local_7f8[local_808 + -1]) /
                               GA[lVar5].num_blocks[local_808 + -1]);
              local_7f8[local_808] = (int)((long)local_804 % GA[lVar5].num_blocks[local_808]);
            }
            for (local_7fc = 0; local_7fc < sVar1; local_7fc = local_7fc + 1) {
              local_718[local_7fc] =
                   (long)local_7f8[local_7fc] * GA[lVar5].block_dims[local_7fc] + 1;
              local_758[local_7fc] =
                   (long)(local_7f8[local_7fc] + 1) * GA[lVar5].block_dims[local_7fc];
              if (GA[lVar5].dims[local_7fc] < local_758[local_7fc]) {
                local_758[local_7fc] = GA[lVar5].dims[local_7fc];
              }
            }
          }
          else if (GA[lVar5].distr_type == 4) {
            sVar1 = GA[lVar5].ndim;
            local_830 = (int)sVar1;
            local_834 = 0;
            sVar2 = GA[lVar5].ndim;
            local_840 = (int)sVar2;
            local_838 = (int)*local_20;
            local_828[0] = (int)((long)(int)*local_20 % GA[lVar5].num_blocks[0]);
            for (local_83c = 1; local_83c < sVar2; local_83c = local_83c + 1) {
              local_838 = (int)((long)(local_838 - local_828[local_83c + -1]) /
                               GA[lVar5].num_blocks[local_83c + -1]);
              local_828[local_83c] = (int)((long)local_838 % GA[lVar5].num_blocks[local_83c]);
            }
            for (local_82c = 0; local_82c < sVar1; local_82c = local_82c + 1) {
              local_718[local_82c] = GA[lVar5].mapc[local_834 + local_828[local_82c]];
              if ((long)local_828[local_82c] < GA[lVar5].num_blocks[local_82c] + -1) {
                local_758[local_82c] = GA[lVar5].mapc[local_834 + local_828[local_82c] + 1] + -1;
              }
              else {
                local_758[local_82c] = GA[lVar5].dims[local_82c];
              }
              local_834 = local_834 + (int)GA[lVar5].num_blocks[local_82c];
            }
          }
          if (local_6d8 == 0) {
            local_3b8[0] = (local_758[0] - local_718[0]) + 1 + GA[lVar5].width[0] * 2;
          }
          for (local_6c8 = 0; local_6c8 < local_6d8; local_6c8 = local_6c8 + 1) {
            local_6e0 = alStack_2f8[local_6c8] * local_6d0 + local_6e0;
            local_3b8[local_6c8] =
                 (local_758[local_6c8] - local_718[local_6c8]) + 1 + GA[lVar5].width[local_6c8] * 2;
            local_6d0 = local_3b8[local_6c8] * local_6d0;
          }
          local_6e0 = alStack_2f8[local_6d8] * local_6d0 + local_6e0;
          *local_3f0 = (double)(GA[lVar5].ptr[*local_20] + local_6e0 * GA[lVar5].elemsize);
          iVar18 = (int)local_28;
          *(int *)pdVar9 = iVar18;
          *piVar10 = iVar18;
          for (local_844 = 0; (long)local_844 < local_30 + -1; local_844 = local_844 + 1) {
            piVar10[local_844] = (int)local_3b8[local_844] * piVar10[local_844];
            *(int *)((long)pdVar9 + (long)local_844 * 4) =
                 (int)local_378[local_844] * *(int *)((long)pdVar9 + (long)local_844 * 4);
            piVar10[local_844 + 1] = piVar10[local_844];
            *(int *)((long)pdVar9 + (long)(local_844 + 1) * 4) =
                 *(int *)((long)pdVar9 + (long)local_844 * 4);
          }
          for (local_848 = 0; local_848 < local_30; local_848 = local_848 + 1) {
            piVar11[local_848] = ((int)alStack_338[local_848] - (int)alStack_2f8[local_848]) + 1;
          }
          *piVar11 = *piVar11 * iVar18;
          if (-1 < lVar8) {
            *local_20 = (long)PGRP_LIST[lVar8].inv_map_proc_list[*local_20];
          }
          plVar15 = plVar4 + 3;
          piVar10 = (int *)((long)plVar15 + local_30 * 4);
          piVar11 = piVar10 + local_30;
          local_20 = (long *)(piVar11 + local_30);
          get_remote_block_pos
                    (CONCAT44(in_stack_fffffffffffff3a4,in_stack_fffffffffffff3a0),
                     CONCAT44(in_stack_fffffffffffff39c,in_stack_fffffffffffff398),
                     in_stack_fffffffffffff390,in_stack_fffffffffffff388,local_b8,local_f8,
                     (Integer *)CONCAT44(in_stack_fffffffffffff3b4,in_stack_fffffffffffff3b0),
                     (Integer *)CONCAT44(in_stack_fffffffffffff3bc,in_stack_fffffffffffff3b8));
          lVar7 = pnga_locate_region(in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
                                     in_stack_fffffffffffffb88,in_stack_fffffffffffffb80,
                                     in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
          if (lVar7 == 0) {
            local_858 = "cannot locate region: ";
            sprintf(local_958,"%s","cannot locate region: ");
            local_84c = 0;
            sVar12 = strlen(local_858);
            local_850 = (int)sVar12;
            sprintf(local_958 + local_850,"%s",GA[local_10 + 1000].name);
            sVar12 = strlen(local_958);
            local_850 = (int)sVar12;
            sprintf(local_958 + (int)sVar12," [%ld:%ld ",local_278[local_84c],local_2b8[local_84c]);
            sVar12 = strlen(local_958);
            local_850 = (int)sVar12;
            local_84c = 1;
            while( true ) {
              in_stack_fffffffffffff388 = (Integer *)(long)local_84c;
              IVar13 = pnga_ndim(in_stack_fffffffffffff570);
              if (IVar13 <= (long)in_stack_fffffffffffff388) break;
              sprintf(local_958 + local_850,",%ld:%ld ",local_278[local_84c],local_2b8[local_84c]);
              sVar12 = strlen(local_958);
              local_850 = (int)sVar12;
              local_84c = local_84c + 1;
            }
            sprintf(local_958 + local_850,"%s","]");
            sVar12 = strlen(local_958);
            local_850 = (int)sVar12;
            pnga_error((char *)CONCAT44(in_stack_fffffffffffff524,in_stack_fffffffffffff520),
                       in_stack_fffffffffffff518);
          }
          *local_20 = *__ptr_00;
          if (-1 < lVar8) {
            *local_20 = (long)PGRP_LIST[lVar8].inv_map_proc_list[*local_20];
          }
          local_3f0 = (double *)(local_20 + 1);
          pnga_distribution(in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
                            in_stack_fffffffffffff690,in_stack_fffffffffffff688);
          for (local_14 = 0; local_14 < local_30; local_14 = local_14 + 1) {
            if (alStack_78[local_14] == 0) {
              if (local_14 == local_3d4) {
                alStack_2f8[local_14] = 0;
                alStack_338[local_14] = local_b8[local_14] + -1;
                aIStack_1b8[local_14] =
                     (local_178[local_14] - local_138[local_14]) + local_b8[local_14] + -1;
              }
              else {
                alStack_2f8[local_14] = local_b8[local_14];
                alStack_338[local_14] =
                     (local_238[local_14] - local_1f8[local_14]) + local_b8[local_14];
                aIStack_1b8[local_14] = local_b8[local_14];
              }
            }
            else {
              alStack_2f8[local_14] = 0;
              alStack_338[local_14] =
                   (local_238[local_14] - local_1f8[local_14]) + alStack_78[local_14];
              aIStack_1b8[local_14] = 0;
            }
          }
          in_stack_fffffffffffff698 = 1;
          in_stack_fffffffffffff690 = (Integer *)(long)(GA[lVar5].ndim + -1);
          lVar20 = 0;
          if (GA[lVar5].distr_type == 0) {
            if (GA[lVar5].num_rstrctd == 0) {
              lVar16 = (long)GA[lVar5].ndim;
              local_a28 = 0;
              local_a08 = 1;
              for (local_a10 = 0; local_a10 < lVar16; local_a10 = local_a10 + 1) {
                local_a08 = GA[lVar5].nblock[local_a10] * local_a08;
              }
              if ((local_a08 + -1 < GAme) || (GAme < 0)) {
                for (local_a10 = 0; local_a10 < lVar16; local_a10 = local_a10 + 1) {
                  local_9b8[local_a10] = 0;
                  local_9f8[local_a10] = -1;
                }
              }
              else {
                local_a18 = GAme;
                for (local_a10 = 0; local_a10 < lVar16; local_a10 = local_a10 + 1) {
                  lVar19 = local_a18 % (long)GA[lVar5].nblock[local_a10];
                  local_a18 = local_a18 / (long)GA[lVar5].nblock[local_a10];
                  lVar17 = lVar19 + local_a28;
                  local_a28 = GA[lVar5].nblock[local_a10] + local_a28;
                  local_9b8[local_a10] = GA[lVar5].mapc[lVar17];
                  if (lVar19 == GA[lVar5].nblock[local_a10] + -1) {
                    local_9f8[local_a10] = GA[lVar5].dims[local_a10];
                  }
                  else {
                    local_9f8[local_a10] = GA[lVar5].mapc[lVar17 + 1] + -1;
                  }
                }
              }
            }
            else if (GAme < GA[lVar5].num_rstrctd) {
              lVar16 = (long)GA[lVar5].ndim;
              local_a60 = 0;
              local_a40 = 1;
              for (local_a48 = 0; local_a48 < lVar16; local_a48 = local_a48 + 1) {
                local_a40 = GA[lVar5].nblock[local_a48] * local_a40;
              }
              if ((local_a40 + -1 < GAme) || (GAme < 0)) {
                for (local_a48 = 0; local_a48 < lVar16; local_a48 = local_a48 + 1) {
                  local_9b8[local_a48] = 0;
                  local_9f8[local_a48] = -1;
                }
              }
              else {
                local_a50 = GAme;
                for (local_a48 = 0; local_a48 < lVar16; local_a48 = local_a48 + 1) {
                  lVar19 = local_a50 % (long)GA[lVar5].nblock[local_a48];
                  local_a50 = local_a50 / (long)GA[lVar5].nblock[local_a48];
                  lVar17 = lVar19 + local_a60;
                  local_a60 = GA[lVar5].nblock[local_a48] + local_a60;
                  local_9b8[local_a48] = GA[lVar5].mapc[lVar17];
                  if (lVar19 == GA[lVar5].nblock[local_a48] + -1) {
                    local_9f8[local_a48] = GA[lVar5].dims[local_a48];
                  }
                  else {
                    local_9f8[local_a48] = GA[lVar5].mapc[lVar17 + 1] + -1;
                  }
                }
              }
            }
            else {
              sVar1 = GA[lVar5].ndim;
              for (local_a6c = 0; local_a6c < sVar1; local_a6c = local_a6c + 1) {
                local_9b8[local_a6c] = 0;
                local_9f8[local_a6c] = -1;
              }
            }
          }
          else {
            local_ad8 = (int)GAme;
            if (((GA[lVar5].distr_type == 1) || (GA[lVar5].distr_type == 2)) ||
               (GA[lVar5].distr_type == 3)) {
              sVar1 = GA[lVar5].ndim;
              local_aa0 = (int)sVar1;
              sVar2 = GA[lVar5].ndim;
              local_aac = (int)sVar2;
              local_aa4 = local_ad8;
              local_a98[0] = (int)((long)local_ad8 % GA[lVar5].num_blocks[0]);
              for (local_aa8 = 1; local_aa8 < sVar2; local_aa8 = local_aa8 + 1) {
                local_aa4 = (int)((long)(local_aa4 - local_a98[local_aa8 + -1]) /
                                 GA[lVar5].num_blocks[local_aa8 + -1]);
                local_a98[local_aa8] = (int)((long)local_aa4 % GA[lVar5].num_blocks[local_aa8]);
              }
              for (local_a9c = 0; local_a9c < sVar1; local_a9c = local_a9c + 1) {
                local_9b8[local_a9c] =
                     (long)local_a98[local_a9c] * GA[lVar5].block_dims[local_a9c] + 1;
                local_9f8[local_a9c] =
                     (long)(local_a98[local_a9c] + 1) * GA[lVar5].block_dims[local_a9c];
                if (GA[lVar5].dims[local_a9c] < local_9f8[local_a9c]) {
                  local_9f8[local_a9c] = GA[lVar5].dims[local_a9c];
                }
              }
            }
            else if (GA[lVar5].distr_type == 4) {
              sVar1 = GA[lVar5].ndim;
              local_ad4 = 0;
              in_stack_fffffffffffff520 = (int)GA[lVar5].ndim;
              local_ac8[0] = (int)((long)local_ad8 % GA[lVar5].num_blocks[0]);
              for (in_stack_fffffffffffff524 = 1;
                  in_stack_fffffffffffff524 < in_stack_fffffffffffff520;
                  in_stack_fffffffffffff524 = in_stack_fffffffffffff524 + 1) {
                local_ad8 = (int)((long)(local_ad8 - local_ac8[in_stack_fffffffffffff524 + -1]) /
                                 GA[lVar5].num_blocks[in_stack_fffffffffffff524 + -1]);
                local_ac8[in_stack_fffffffffffff524] =
                     (int)((long)local_ad8 % GA[lVar5].num_blocks[in_stack_fffffffffffff524]);
              }
              for (local_acc = 0; local_acc < sVar1; local_acc = local_acc + 1) {
                local_9b8[local_acc] = GA[lVar5].mapc[local_ad4 + local_ac8[local_acc]];
                if ((long)local_ac8[local_acc] < GA[lVar5].num_blocks[local_acc] + -1) {
                  local_9f8[local_acc] = GA[lVar5].mapc[local_ad4 + local_ac8[local_acc] + 1] + -1;
                }
                else {
                  local_9f8[local_acc] = GA[lVar5].dims[local_acc];
                }
                local_ad4 = local_ad4 + (int)GA[lVar5].num_blocks[local_acc];
              }
            }
          }
          if (in_stack_fffffffffffff690 == (Integer *)0x0) {
            local_378[0] = (local_9f8[0] - local_9b8[0]) + 1 + GA[lVar5].width[0] * 2;
          }
          for (in_stack_fffffffffffff6a0 = 0;
              in_stack_fffffffffffff6a0 < (long)in_stack_fffffffffffff690;
              in_stack_fffffffffffff6a0 = in_stack_fffffffffffff6a0 + 1) {
            lVar20 = aIStack_1b8[in_stack_fffffffffffff6a0] * in_stack_fffffffffffff698 + lVar20;
            local_378[in_stack_fffffffffffff6a0] =
                 (local_9f8[in_stack_fffffffffffff6a0] - local_9b8[in_stack_fffffffffffff6a0]) + 1 +
                 GA[lVar5].width[in_stack_fffffffffffff6a0] * 2;
            in_stack_fffffffffffff698 =
                 local_378[in_stack_fffffffffffff6a0] * in_stack_fffffffffffff698;
          }
          in_stack_fffffffffffff688 =
               (Integer *)
               (aIStack_1b8[(long)in_stack_fffffffffffff690] * in_stack_fffffffffffff698 + lVar20);
          plVar4[2] = (long)(GA[lVar5].ptr[GAme] +
                            (long)in_stack_fffffffffffff688 * (long)GA[lVar5].elemsize);
          local_af0 = 1;
          local_af8 = (long)(GA[lVar5].ndim + -1);
          local_b00 = 0;
          if (GA[lVar5].distr_type == 0) {
            if (GA[lVar5].num_rstrctd == 0) {
              local_ba0 = (long)GA[lVar5].ndim;
              local_ba8 = 0;
              local_b88 = 1;
              for (local_b90 = 0; local_b90 < local_ba0; local_b90 = local_b90 + 1) {
                local_b88 = GA[lVar5].nblock[local_b90] * local_b88;
              }
              if ((local_b88 + -1 < *local_20) || (*local_20 < 0)) {
                for (local_b90 = 0; local_b90 < local_ba0; local_b90 = local_b90 + 1) {
                  local_b38[local_b90] = 0;
                  local_b78[local_b90] = -1;
                }
              }
              else {
                local_b98 = *local_20;
                for (local_b90 = 0; local_b90 < local_ba0; local_b90 = local_b90 + 1) {
                  local_b80 = local_b98 % (long)GA[lVar5].nblock[local_b90];
                  local_b98 = local_b98 / (long)GA[lVar5].nblock[local_b90];
                  local_bb0 = local_b80 + local_ba8;
                  local_ba8 = GA[lVar5].nblock[local_b90] + local_ba8;
                  local_b38[local_b90] = GA[lVar5].mapc[local_bb0];
                  if (local_b80 == GA[lVar5].nblock[local_b90] + -1) {
                    local_b78[local_b90] = GA[lVar5].dims[local_b90];
                  }
                  else {
                    local_b78[local_b90] = GA[lVar5].mapc[local_bb0 + 1] + -1;
                  }
                }
              }
            }
            else if (*local_20 < GA[lVar5].num_rstrctd) {
              local_bd8 = (long)GA[lVar5].ndim;
              local_be0 = 0;
              local_bc0 = 1;
              for (local_bc8 = 0; local_bc8 < local_bd8; local_bc8 = local_bc8 + 1) {
                local_bc0 = GA[lVar5].nblock[local_bc8] * local_bc0;
              }
              if ((local_bc0 + -1 < *local_20) || (*local_20 < 0)) {
                for (local_bc8 = 0; local_bc8 < local_bd8; local_bc8 = local_bc8 + 1) {
                  local_b38[local_bc8] = 0;
                  local_b78[local_bc8] = -1;
                }
              }
              else {
                local_bd0 = *local_20;
                for (local_bc8 = 0; local_bc8 < local_bd8; local_bc8 = local_bc8 + 1) {
                  local_bb8 = local_bd0 % (long)GA[lVar5].nblock[local_bc8];
                  local_bd0 = local_bd0 / (long)GA[lVar5].nblock[local_bc8];
                  local_be8 = local_bb8 + local_be0;
                  local_be0 = GA[lVar5].nblock[local_bc8] + local_be0;
                  local_b38[local_bc8] = GA[lVar5].mapc[local_be8];
                  if (local_bb8 == GA[lVar5].nblock[local_bc8] + -1) {
                    local_b78[local_bc8] = GA[lVar5].dims[local_bc8];
                  }
                  else {
                    local_b78[local_bc8] = GA[lVar5].mapc[local_be8 + 1] + -1;
                  }
                }
              }
            }
            else {
              sVar1 = GA[lVar5].ndim;
              local_bf0 = (int)sVar1;
              for (local_bec = 0; local_bec < sVar1; local_bec = local_bec + 1) {
                local_b38[local_bec] = 0;
                local_b78[local_bec] = -1;
              }
            }
          }
          else if (((GA[lVar5].distr_type == 1) || (GA[lVar5].distr_type == 2)) ||
                  (GA[lVar5].distr_type == 3)) {
            sVar1 = GA[lVar5].ndim;
            sVar2 = GA[lVar5].ndim;
            local_c24 = (int)*local_20;
            local_c18[0] = (int)((long)local_c24 % GA[lVar5].num_blocks[0]);
            for (local_c28 = 1; local_c28 < sVar2; local_c28 = local_c28 + 1) {
              local_c24 = (int)((long)(local_c24 - local_c18[local_c28 + -1]) /
                               GA[lVar5].num_blocks[local_c28 + -1]);
              local_c18[local_c28] = (int)((long)local_c24 % GA[lVar5].num_blocks[local_c28]);
            }
            for (local_c1c = 0; local_c1c < sVar1; local_c1c = local_c1c + 1) {
              local_b38[local_c1c] =
                   (long)local_c18[local_c1c] * GA[lVar5].block_dims[local_c1c] + 1;
              local_b78[local_c1c] =
                   (long)(local_c18[local_c1c] + 1) * GA[lVar5].block_dims[local_c1c];
              if (GA[lVar5].dims[local_c1c] < local_b78[local_c1c]) {
                local_b78[local_c1c] = GA[lVar5].dims[local_c1c];
              }
            }
          }
          else if (GA[lVar5].distr_type == 4) {
            in_stack_fffffffffffff3b0 = (int)GA[lVar5].ndim;
            local_c54 = 0;
            in_stack_fffffffffffff3a0 = (int)GA[lVar5].ndim;
            local_c58 = (int)*local_20;
            in_stack_fffffffffffff3b8 = (undefined4)((long)local_c58 % GA[lVar5].num_blocks[0]);
            for (in_stack_fffffffffffff3a4 = 1;
                in_stack_fffffffffffff3a4 < in_stack_fffffffffffff3a0;
                in_stack_fffffffffffff3a4 = in_stack_fffffffffffff3a4 + 1) {
              local_c58 = (int)((long)(local_c58 -
                                      *(int *)(&stack0xfffffffffffff3b8 +
                                              (long)(in_stack_fffffffffffff3a4 + -1) * 4)) /
                               GA[lVar5].num_blocks[in_stack_fffffffffffff3a4 + -1]);
              *(int *)(&stack0xfffffffffffff3b8 + (long)in_stack_fffffffffffff3a4 * 4) =
                   (int)((long)local_c58 % GA[lVar5].num_blocks[in_stack_fffffffffffff3a4]);
            }
            for (in_stack_fffffffffffff3b4 = 0;
                in_stack_fffffffffffff3b4 < in_stack_fffffffffffff3b0;
                in_stack_fffffffffffff3b4 = in_stack_fffffffffffff3b4 + 1) {
              local_b38[in_stack_fffffffffffff3b4] =
                   GA[lVar5].mapc
                   [local_c54 +
                    *(int *)(&stack0xfffffffffffff3b8 + (long)in_stack_fffffffffffff3b4 * 4)];
              if ((long)*(int *)(&stack0xfffffffffffff3b8 + (long)in_stack_fffffffffffff3b4 * 4) <
                  GA[lVar5].num_blocks[in_stack_fffffffffffff3b4] + -1) {
                local_b78[in_stack_fffffffffffff3b4] =
                     GA[lVar5].mapc
                     [local_c54 +
                      *(int *)(&stack0xfffffffffffff3b8 + (long)in_stack_fffffffffffff3b4 * 4) + 1]
                     + -1;
              }
              else {
                local_b78[in_stack_fffffffffffff3b4] = GA[lVar5].dims[in_stack_fffffffffffff3b4];
              }
              local_c54 = local_c54 + (int)GA[lVar5].num_blocks[in_stack_fffffffffffff3b4];
            }
          }
          if (local_af8 == 0) {
            local_3b8[0] = (local_b78[0] - local_b38[0]) + 1 + GA[lVar5].width[0] * 2;
          }
          for (in_stack_fffffffffffff518 = 0; in_stack_fffffffffffff518 < local_af8;
              in_stack_fffffffffffff518 = in_stack_fffffffffffff518 + 1) {
            local_b00 = alStack_2f8[in_stack_fffffffffffff518] * local_af0 + local_b00;
            local_3b8[in_stack_fffffffffffff518] =
                 (local_b78[in_stack_fffffffffffff518] - local_b38[in_stack_fffffffffffff518]) + 1 +
                 GA[lVar5].width[in_stack_fffffffffffff518] * 2;
            local_af0 = local_3b8[in_stack_fffffffffffff518] * local_af0;
          }
          local_b00 = alStack_2f8[local_af8] * local_af0 + local_b00;
          *plVar14 = (long)(GA[lVar5].ptr[*local_20] + local_b00 * GA[lVar5].elemsize);
          iVar18 = (int)local_28;
          *(int *)plVar15 = iVar18;
          *piVar10 = iVar18;
          for (in_stack_fffffffffffff39c = 0; (long)in_stack_fffffffffffff39c < local_30 + -1;
              in_stack_fffffffffffff39c = in_stack_fffffffffffff39c + 1) {
            piVar10[in_stack_fffffffffffff39c] =
                 (int)local_3b8[in_stack_fffffffffffff39c] * piVar10[in_stack_fffffffffffff39c];
            *(int *)((long)plVar15 + (long)in_stack_fffffffffffff39c * 4) =
                 (int)local_378[in_stack_fffffffffffff39c] *
                 *(int *)((long)plVar15 + (long)in_stack_fffffffffffff39c * 4);
            piVar10[in_stack_fffffffffffff39c + 1] = piVar10[in_stack_fffffffffffff39c];
            *(int *)((long)plVar15 + (long)(in_stack_fffffffffffff39c + 1) * 4) =
                 *(int *)((long)plVar15 + (long)in_stack_fffffffffffff39c * 4);
          }
          for (in_stack_fffffffffffff398 = 0; in_stack_fffffffffffff398 < local_30;
              in_stack_fffffffffffff398 = in_stack_fffffffffffff398 + 1) {
            piVar11[in_stack_fffffffffffff398] =
                 ((int)alStack_338[in_stack_fffffffffffff398] -
                 (int)alStack_2f8[in_stack_fffffffffffff398]) + 1;
          }
          *piVar11 = *piVar11 * iVar18;
          if (-1 < lVar8) {
            *local_20 = (long)PGRP_LIST[lVar8].inv_map_proc_list[*local_20];
          }
          if (iVar3 != 0) {
            alStack_78[local_3d4] = local_38 << 1;
          }
        }
      }
      free(__ptr);
      free(__ptr_00);
      local_8 = 1;
    }
  }
  return local_8;
}

Assistant:

logical pnga_set_update5_info(Integer g_a)
{
  int i;
  Integer *proc_rem;
  Integer size, ndim, nwidth, increment[MAXDIM],np;
  Integer width[MAXDIM];
  Integer dims[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_loc[MAXDIM]/*, phi_loc[MAXDIM]*/;
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer slo_rem[MAXDIM], shi_rem[MAXDIM];
  Integer plo_rem[MAXDIM], phi_rem[MAXDIM];
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  int *stride_loc, *stride_rem,*count;
  int idx, corner_flag;
  char **ptr_loc, **ptr_rem,*cache;
  Integer handle = GA_OFFSET + g_a;
  int cache_size;
#ifdef UPDATE_SAMENODE_GHOSTS_FIRST
  int scope;
#endif
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* This routine sets up the arrays that are used to transfer data
   * using the update5 algorithm. The arrays begining with the character
   * "p" represent relative indices marking the location of the data set
   * relative to the origin the local patch of the global array, all
   * other indices are in absolute coordinates and mark locations in the
   * total global array. The indices used by this routine are described
   * below.
   *
   *       lo_loc[], hi_loc[]: The lower and upper indices of the visible
   *       block of data held by the calling processor.
   *
   *       lo_rem[], hi_rem[]: The lower and upper indices of the block
   *       of data on a remote processor or processors that is needed to
   *       fill in the calling processors ghost cells. These indices are
   *       NOT corrected for wrap-around (periodic) boundary conditions
   *       so they can be negative or greater than the array dimension
   *       values held in dims[].
   *
   *       slo_rem[], shi_rem[]: Similar to lo_rem[] and hi_rem[], except
   *       that these indices have been corrected for wrap-around
   *       boundary conditions. 
   *
   *       thi_rem[], thi_rem[]: The lower and upper indices of the visible
   *       data on a remote processor.
   *
   *       plo_loc[], phi_loc[]: The indices of the local data patch that
   *       is going to be updated.
   *
   *       plo_rem[], phi_rem[]: The indices of the data patch on the
   *       remote processor that will be used to update the data on the
   *       calling processor. Note that the dimensions of the patches
   *       represented by plo_loc[], plo_rem[] and plo_loc[], phi_loc[]
   *       must be the same.
   */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return TRUE;

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater
     than the corresponding value in width[]. */
  if (!gai_check_ghost_distr(g_a)) return FALSE;

  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;
  size = GA[handle].elemsize;
  cache_size = 2*sizeof(char *)+3*sizeof(int)+sizeof(Integer);
  cache_size = 2*ndim*((cache_size/sizeof(double)) + 1);
  GA[handle].cache = (double *)malloc(sizeof(double)*cache_size);
  cache = (char *)GA[handle].cache;
  corner_flag = GA[handle].corner_flag;

  pnga_distribution(g_a,me,lo_loc,hi_loc); 
  for (idx=0; idx < ndim; idx++) {
    increment[idx] = 0;
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
    if (lo_loc[idx] == 0 && hi_loc[idx] == -1){
      *(char **)cache = NULL; 
      return FALSE;
    }
  } 

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_set_update5_info:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_set_update5_info:malloc failed (_ga_proclist)",0);

#ifdef UPDATE_SAMENODE_GHOSTS_FIRST
  for(scope=0;scope < 2; scope ++)
#endif
    for (idx=0; idx < ndim; idx++) {
      nwidth = width[idx];
      if (nwidth != 0) {  
      
        ptr_rem = (char **)cache;
        ptr_loc = (char **)(cache+sizeof(char *));
        stride_loc = (int *)(cache+2*sizeof(char *));
        stride_rem = (int *)(stride_loc+ndim);
        count = (int *)(stride_rem+ndim);
        proc_rem = (Integer *)(count+ndim);

        get_remote_block_neg(idx, ndim, lo_loc, hi_loc, slo_rem, shi_rem,
                             dims, width);
        if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
            _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
            slo_rem, shi_rem, g_a);

        *proc_rem = (Integer)_ga_proclist[0];
        if (p_handle >= 0) {
          *proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem];
        }

#ifdef UPDATE_SAMENODE_GHOSTS_FIRST
        if(scope == 0 && ARMCI_Same_node(*proc_rem))
          goto do_negative;
#endif

        cache = (char *)(proc_rem+1);

        pnga_distribution(g_a, *proc_rem, tlo_rem, thi_rem);
        

        for (i = 0; i < ndim; i++) {
          if (increment[i] == 0) {
            if (i == idx) {
              plo_rem[i] = thi_rem[i] - tlo_rem[i] + width[i] + 1;
              phi_rem[i] = thi_rem[i] - tlo_rem[i] + 2*width[i];
              plo_loc[i] = width[i];
              /*phi_loc[i] = 2*width[i] - 1;*/
            } else {
              plo_rem[i] = width[i];
              phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
              plo_loc[i] = width[i];
              /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
            }
          } else {
            plo_rem[i] = 0;
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
            plo_loc[i] = 0;
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
          }
        }
        gam_LocationWithGhosts(me, handle, plo_loc, ptr_loc, ld_loc);
        gam_LocationWithGhosts(*proc_rem, handle, plo_rem, ptr_rem, ld_rem);
 
        /* Evaluate strides on local and remote processors */
        gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
            stride_loc);
        gam_ComputeCount(ndim, plo_rem, phi_rem, count);
        count[0] *= size;
        if (p_handle >= 0) {
          *proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem];
        }

#ifdef UPDATE_SAMENODE_GHOSTS_FIRST
        do_negative:
#endif

       /*BJP proc_rem++; */
        ptr_rem = (char **)cache;
        ptr_loc = (char **)(cache+sizeof(char *));
        stride_loc = (int *)(cache+2*sizeof(char *));
        stride_rem = (int *)(stride_loc+ndim);
        count = (int *)(stride_rem+ndim);
        proc_rem = (Integer *)(count+ndim);

        get_remote_block_pos(idx, ndim, lo_loc, hi_loc, slo_rem, shi_rem,
                             dims, width);

        if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
            _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
            slo_rem, shi_rem, g_a);

        *proc_rem = (Integer)_ga_proclist[0];
        if (p_handle >= 0) {
          *proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem];
        }

#ifdef UPDATE_SAMENODE_GHOSTS_FIRST
        if(scope == 0 && ARMCI_Same_node(*proc_rem))
          continue;
#endif

        cache = (char *)(proc_rem+1);

        pnga_distribution(g_a, *proc_rem, tlo_rem, thi_rem);



        for (i = 0; i < ndim; i++) {
          if (increment[i] == 0) {
            if (i == idx) {
              plo_rem[i] = 0;
              phi_rem[i] = width[i] - 1;
              plo_loc[i] = hi_loc[i] - lo_loc[i] + width[i] - 1;
              /*phi_loc[i] = hi_loc[i] - lo_loc[i] + 2*width[i] - 1;*/
            } else {
              plo_rem[i] = width[i];
              phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
              plo_loc[i] = width[i];
              /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
            }
          } else {
            plo_rem[i] = 0;
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
            plo_loc[i] = 0;
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
          }
        }


        gam_LocationWithGhosts(GAme, handle, plo_loc, ptr_loc, ld_loc);
        gam_LocationWithGhosts(*proc_rem, handle, plo_rem, ptr_rem, ld_rem);

        gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
            stride_loc);

        gam_ComputeCount(ndim, plo_rem, phi_rem, count);
        count[0] *= size;
        if (p_handle >= 0) {
          *proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem];
        }

        if (corner_flag)
          increment[idx] = 2*nwidth;
      }
    }
    free(_ga_map);
    free(_ga_proclist);
    return TRUE;
}